

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

char * QtPrivate::QTypeNormalizer::skipTemplate(char *x,char *e,bool stopAtComa)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  iVar2 = 0;
LAB_001270a3:
  do {
    if (x == e) {
      return x;
    }
    cVar1 = *x;
    switch(cVar1) {
    case '\"':
      goto switchD_001270be_caseD_22;
    case '#':
    case '$':
    case '%':
    case '&':
    case '*':
    case '+':
      break;
    case '\'':
      if ((byte)(x[-1] - 0x30U) < 10) break;
      goto switchD_001270be_caseD_22;
    case '(':
switchD_001270be_caseD_28:
      iVar3 = iVar3 + 1;
      break;
    case ')':
switchD_001270be_caseD_29:
      iVar3 = iVar3 + -1;
      break;
    case ',':
      if ((iVar3 == 0 && stopAtComa) && (iVar2 == 0)) {
        return x;
      }
      break;
    default:
      if (cVar1 == '}') goto switchD_001270be_caseD_29;
      if (cVar1 != '>') {
        if (cVar1 != '[') {
          if (cVar1 == ']') goto switchD_001270be_caseD_29;
          if (cVar1 != '{') {
            if (cVar1 == '<') {
              iVar2 = iVar2 + (uint)(iVar3 == 0);
            }
            break;
          }
        }
        goto switchD_001270be_caseD_28;
      }
      if (iVar3 == 0) {
        if (iVar2 < 1) {
          return x;
        }
        iVar2 = iVar2 + -1;
        iVar3 = 0;
      }
    }
    x = x + 1;
  } while( true );
switchD_001270be_caseD_22:
  x = skipString(x,e);
  goto LAB_001270a3;
}

Assistant:

static constexpr const char *skipTemplate(const char *x, const char *e, bool stopAtComa = false)
    {
        int scopeDepth = 0;
        int templateDepth = 0;
        while (x != e) {
            switch (*x) {
            case '<':
                if (!scopeDepth)
                    templateDepth++;
                break;
            case ',':
                if (stopAtComa && !scopeDepth && !templateDepth)
                    return x;
                break;
            case '>':
                if (!scopeDepth)
                    if (--templateDepth < 0)
                        return x;
                break;
            case '(':
            case '[':
            case '{':
                scopeDepth++;
                break;
            case '}':
            case ']':
            case ')':
                scopeDepth--;
                break;
            case '\'':
                if (is_number(x[-1]))
                    break;
                Q_FALLTHROUGH();
            case '\"':
                x = skipString(x, e);
                continue;
            }
            x++;
        }
        return x;
    }